

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  pointer phVar1;
  pointer phVar2;
  array_storage *storage;
  ulong uVar3;
  pointer phVar4;
  
  switch((byte)(this->field_0).json_const_pointer_ & 0xf) {
  case 0xc:
    phVar1 = (this->field_0).byte_str_.ptr_;
    if (phVar1 == (pointer)0x0) {
      return;
    }
    phVar4 = (pointer)((long)phVar1 - (ulong)phVar1->offset_);
    uVar3 = (ulong)phVar1->align_pad_ + (ulong)phVar1->offset_ + phVar1->length_ + 0x30;
    goto LAB_002bb42b;
  case 0xd:
    phVar1 = (this->field_0).byte_str_.ptr_;
    if (phVar1 == (pointer)0x0) {
      return;
    }
    sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
    ::flatten_and_destroy
              ((sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                *)phVar1);
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((key_value_container_type *)
              &(phVar1->super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8);
    break;
  case 0xe:
    phVar1 = (this->field_0).byte_str_.ptr_;
    if (phVar1 == (pointer)0x0) {
      return;
    }
    json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
    ::flatten_and_destroy
              ((json_array<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                *)phVar1);
    std::
    vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
    ::~vector((value_container_type *)
              &(phVar1->super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8);
    break;
  case 0xf:
    phVar2 = (this->field_0).long_str_.ptr_;
    if (phVar2 == (pointer)0x0) {
      return;
    }
    phVar4 = (pointer)((long)phVar2 - (ulong)phVar2->offset_);
    uVar3 = (ulong)phVar2->align_pad_ + (ulong)phVar2->offset_ + phVar2->length_ * 4 + 0x28;
    goto LAB_002bb42b;
  default:
    return;
  }
  phVar4 = (this->field_0).long_str_.ptr_;
  uVar3 = 0x20;
LAB_002bb42b:
  operator_delete(phVar4,uVar3);
  return;
}

Assistant:

void destroy()
        {
            switch (storage_kind())
            {
                case json_storage_kind::long_str:
                {
                    if (cast<long_string_storage>().ptr_ != nullptr)
                    {
                        long_string_storage::heap_string_factory_type::destroy(cast<long_string_storage>().ptr_);
                    }
                    break;
                }
                case json_storage_kind::byte_str:
                    if (cast<byte_string_storage>().ptr_ != nullptr)
                    {
                        byte_string_storage::heap_string_factory_type::destroy(cast<byte_string_storage>().ptr_);
                    }
                    break;
                case json_storage_kind::array:
                {
                    if (cast<array_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<array_storage>();
                        typename array_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename array_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename array_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                case json_storage_kind::object:
                {
                    if (cast<object_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<object_storage>();
                        typename object_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename object_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename object_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                default:
                    break;
            }
        }